

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O3

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_cover_from_file(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this,
                   string *cover_file_name)

{
  map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
  *this_00;
  int iVar1;
  iterator __position;
  bool bVar2;
  long lVar3;
  mapped_type_conflict1 mVar4;
  pointer piVar5;
  char cVar6;
  int iVar7;
  istream *piVar8;
  long *plVar9;
  mapped_type_conflict1 *pmVar10;
  mapped_type *pmVar11;
  vector<int,std::allocator<int>> *this_01;
  ulong uVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  pointer piVar16;
  int i;
  int cov;
  vector<int,_std::allocator<int>_> cov_number;
  vector<int,_std::allocator<int>_> cov_elts;
  string line;
  stringstream stream;
  ifstream input;
  int local_430;
  mapped_type_conflict1 local_42c;
  vector<int,_std::allocator<int>_> local_428;
  vector<int,_std::allocator<int>_> local_408;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0;
  undefined7 uStack_3df;
  string *local_3d0;
  double local_3c8;
  key_type local_3c0 [32];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_430 = 0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_3d0 = cover_file_name;
  std::ifstream::ifstream(local_238,(string *)cover_file_name,_S_in);
  local_3f0 = &local_3e0;
  local_3e8 = 0;
  local_3e0 = 0;
  this_00 = &this->cover_color;
  while( true ) {
    cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3f0,cVar6);
    piVar5 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    piVar16 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
    if (local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_3c0,(string *)&local_3f0,_S_out|_S_in);
    while (plVar9 = (long *)std::istream::operator>>((istream *)local_3c0,&local_42c),
          (*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) == 0) {
      if (local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_408,
                   (iterator)
                   local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_42c);
      }
      else {
        *local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_42c;
        local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_428,
                   (iterator)
                   local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_42c);
      }
      else {
        *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_42c;
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      mVar4 = local_42c;
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&this->cover_fct,&local_42c);
      *pmVar10 = mVar4;
      local_3c8 = (this->func_color).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[local_430];
      pmVar11 = std::
                map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
                ::operator[](this_00,&local_42c);
      pmVar11->second = local_3c8 + pmVar11->second;
      pmVar11 = std::
                map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
                ::operator[](this_00,&local_42c);
      pmVar11->first = pmVar11->first + 1;
      this_01 = (vector<int,std::allocator<int>> *)
                std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->cover_back,&local_42c);
      __position._M_current = *(int **)(this_01 + 8);
      if (__position._M_current == *(int **)(this_01 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_01,__position,&local_430);
      }
      else {
        *__position._M_current = local_430;
        *(int **)(this_01 + 8) = __position._M_current + 1;
      }
    }
    std::vector<int,_std::allocator<int>_>::operator=
              ((this->cover).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_430,&local_408);
    local_430 = local_430 + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar12 = (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar16,piVar5);
    piVar16 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar15 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      do {
        piVar13 = piVar15;
        if (piVar13 ==
            local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) goto LAB_00108945;
        piVar15 = piVar13 + 1;
      } while (piVar13[-1] != *piVar13);
      piVar14 = piVar13 + -1;
      iVar7 = piVar13[-1];
      for (; piVar15 !=
             local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish; piVar15 = piVar15 + 1) {
        iVar1 = *piVar15;
        if (iVar7 != iVar1) {
          piVar14[1] = iVar1;
          piVar14 = piVar14 + 1;
        }
        iVar7 = iVar1;
      }
      piVar16 = piVar14 + 1;
    }
  }
LAB_00108945:
  std::vector<int,_std::allocator<int>_>::resize
            (&local_428,
             (long)piVar16 -
             (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  iVar7 = (int)((ulong)((long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + -1;
  this->maximal_dim = iVar7;
  local_3c0[0] = 0;
  if (-1 < iVar7) {
    do {
      pmVar11 = std::
                map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
                ::operator[](this_00,local_3c0);
      iVar7 = pmVar11->first;
      pmVar11 = std::
                map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
                ::operator[](this_00,local_3c0);
      pmVar11->second = pmVar11->second / (double)iVar7;
      iVar7 = local_3c0[0] + 1;
      bVar2 = local_3c0[0] < this->maximal_dim;
      local_3c0[0] = iVar7;
    } while (bVar2);
  }
  std::__cxx11::string::_M_assign((string *)&this->cover_name);
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
  }
  std::ifstream::~ifstream(local_238);
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void set_cover_from_file(const std::string& cover_file_name) {
    int i = 0;
    int cov;
    std::vector<int> cov_elts, cov_number;
    std::ifstream input(cover_file_name);
    std::string line;
    while (std::getline(input, line)) {
      cov_elts.clear();
      std::stringstream stream(line);
      while (stream >> cov) {
        cov_elts.push_back(cov);
        cov_number.push_back(cov);
        cover_fct[cov] = cov;
        cover_color[cov].second += func_color[i];
        cover_color[cov].first++;
        cover_back[cov].push_back(i);
      }
      cover[i] = cov_elts;
      i++;
    }

    std::sort(cov_number.begin(), cov_number.end());
    std::vector<int>::iterator it = std::unique(cov_number.begin(), cov_number.end());
    cov_number.resize(std::distance(cov_number.begin(), it));

    maximal_dim = cov_number.size() - 1;
    for (int i = 0; i <= maximal_dim; i++) cover_color[i].second /= cover_color[i].first;
    cover_name = cover_file_name;
  }